

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.cpp
# Opt level: O3

void __thiscall despot::TabularCPT::ComputeSparseChildDistribution(TabularCPT *this)

{
  vector<std::pair<int,double>,std::allocator<std::pair<int,double>>> *this_00;
  iterator __position;
  uint uVar1;
  uint uVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  pair<int,_double> local_40;
  
  uVar1 = (*(this->super_CPT).super_Function._vptr_Function[7])();
  uVar2 = (*(this->super_CPT).super_Function._vptr_Function[9])(this);
  std::
  vector<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
  ::resize(&this->sparse_values_,(long)(int)uVar1);
  if (0 < (int)uVar1) {
    uVar5 = 0;
    do {
      if (0 < (int)uVar2) {
        uVar4 = 0;
        do {
          iVar3 = (int)uVar4;
          (*(this->super_CPT).super_Function._vptr_Function[4])(this,uVar5 & 0xffffffff,uVar4);
          if (0.0 < extraout_XMM0_Qa) {
            this_00 = (vector<std::pair<int,double>,std::allocator<std::pair<int,double>>> *)
                      ((this->sparse_values_).
                       super__Vector_base<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + uVar5);
            (*(this->super_CPT).super_Function._vptr_Function[4])(this,uVar5 & 0xffffffff,uVar4);
            __position._M_current = *(pair<int,_double> **)(this_00 + 8);
            local_40.first = iVar3;
            if (__position._M_current == *(pair<int,_double> **)(this_00 + 0x10)) {
              std::vector<std::pair<int,double>,std::allocator<std::pair<int,double>>>::
              _M_realloc_insert<std::pair<int,double>>(this_00,__position,&local_40);
            }
            else {
              *(ulong *)__position._M_current = CONCAT44(local_40._4_4_,iVar3);
              (__position._M_current)->second = extraout_XMM0_Qa_00;
              *(long *)(this_00 + 8) = *(long *)(this_00 + 8) + 0x10;
            }
          }
          uVar4 = (ulong)(iVar3 + 1U);
        } while (uVar2 != iVar3 + 1U);
      }
      uVar5 = uVar5 + 1;
    } while (uVar5 != uVar1);
  }
  return;
}

Assistant:

void TabularCPT::ComputeSparseChildDistribution() {
	int parent_size = ParentSize(), child_size = ChildSize();
	sparse_values_.resize(parent_size);
	for (int p = 0; p < parent_size; p++) {
		for (int c = 0; c < child_size; c++) {
			if (GetValue(p, c) > 0)
				sparse_values_[p].push_back(
					pair<int, double>(c, GetValue(p, c)));
		}
	}
}